

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O1

void __thiscall QAccessibleComboBox::doAction(QAccessibleComboBox *this)

{
  QString *in_RSI;
  
  doAction((QAccessibleComboBox *)&this[-1].super_QAccessibleWidget.super_QAccessibleActionInterface
           ,in_RSI);
  return;
}

Assistant:

void QAccessibleComboBox::doAction(const QString &actionName)
{
    if (QComboBox *cBox = comboBox()) {
        if (actionName == showMenuAction() || actionName == pressAction()) {
            if (cBox->view()->isVisible()) {
#if defined(Q_OS_ANDROID)
                const auto list = child(0)->tableInterface();
                if (list && list->selectedRowCount() > 0) {
                    cBox->setCurrentIndex(list->selectedRows().at(0));
                }
                cBox->setFocus();
#endif
                cBox->hidePopup();
            } else {
                cBox->showPopup();
#if defined(Q_OS_ANDROID)
                const auto list = child(0)->tableInterface();
                if (list && list->selectedRowCount() > 0) {
                    auto selectedCells = list->selectedCells();
                    QAccessibleEvent ev(selectedCells.at(0),QAccessible::Focus);
                    QAccessible::updateAccessibility(&ev);
                }
#endif
            }
        }
    }
}